

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

void __thiscall spirv_cross::CompilerMSL::emit_mesh_entry_point(CompilerMSL *this)

{
  uint32_t id;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
  *this_01;
  size_t sVar1;
  iterator __position;
  pointer puVar2;
  iterator iVar3;
  Instruction *pIVar4;
  SPIREntryPoint *pSVar5;
  uint32_t id_00;
  SPIRFunction *pSVar6;
  SPIRFunction *pSVar7;
  SPIRBlock *pSVar8;
  mapped_type *pmVar9;
  mapped_type *this_02;
  uint32_t ret_id;
  SPIREntryPoint proxy_ep;
  uint local_22c;
  SPIREntryPoint *local_228;
  key_type local_21c;
  key_type local_218 [2];
  undefined1 local_210 [136];
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_188;
  undefined1 local_120 [136];
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_98;
  
  local_228 = Compiler::get_entry_point((Compiler *)this);
  pSVar6 = Variant::get<spirv_cross::SPIRFunction>
                     ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                      super_VectorView<spirv_cross::Variant>.ptr +
                      (this->super_CompilerGLSL).super_Compiler.ir.default_entry_point.id);
  id_00 = ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,3);
  id = id_00 + 1;
  local_22c = id_00 + 2;
  pSVar7 = Compiler::
           set<spirv_cross::SPIRFunction,spirv_cross::TypedID<(spirv_cross::Types)1>&,spirv_cross::TypedID<(spirv_cross::Types)1>&>
                     ((Compiler *)this,id_00,
                      (TypedID<(spirv_cross::Types)1> *)&(pSVar6->super_IVariant).field_0xc,
                      &pSVar6->function_type);
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)6>,_8UL>::reserve
            (&pSVar7->blocks,
             (pSVar7->blocks).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)6>_>.
             buffer_size + 1);
  sVar1 = (pSVar7->blocks).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)6>_>.
          buffer_size;
  (pSVar7->blocks).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)6>_>.ptr[sVar1].id = id
  ;
  (pSVar7->blocks).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)6>_>.buffer_size =
       sVar1 + 1;
  (pSVar7->entry_block).id = id;
  pSVar8 = Compiler::set<spirv_cross::SPIRBlock>((Compiler *)this,id);
  *(undefined4 *)&(pSVar8->super_IVariant).field_0xc = 4;
  this_00 = &(this->super_CompilerGLSL).super_Compiler.ir.spirv;
  __position._M_current =
       *(pointer *)
        ((long)&(this->super_CompilerGLSL).super_Compiler.ir.spirv.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data + 8);
  puVar2 = (this->super_CompilerGLSL).super_Compiler.ir.spirv.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_218[0].id = *(uint32_t *)&(pSVar6->super_IVariant).field_0xc;
  if (__position._M_current ==
      *(pointer *)
       ((long)&(this->super_CompilerGLSL).super_Compiler.ir.spirv.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data + 0x10)) {
    ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (this_00,__position,&local_218[0].id);
  }
  else {
    *__position._M_current = local_218[0].id;
    *(uint **)((long)&(this->super_CompilerGLSL).super_Compiler.ir.spirv.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data + 8) = __position._M_current + 1;
  }
  pSVar5 = local_228;
  iVar3._M_current =
       *(pointer *)
        ((long)&(this->super_CompilerGLSL).super_Compiler.ir.spirv.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data + 8);
  if (iVar3._M_current ==
      *(pointer *)
       ((long)&(this->super_CompilerGLSL).super_Compiler.ir.spirv.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data + 0x10)) {
    ::std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)this_00,iVar3,&local_22c);
  }
  else {
    *iVar3._M_current = local_22c;
    *(uint **)((long)&(this->super_CompilerGLSL).super_Compiler.ir.spirv.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data + 8) = iVar3._M_current + 1;
  }
  local_218[0].id = (pSVar5->self).id;
  iVar3._M_current =
       *(pointer *)
        ((long)&(this->super_CompilerGLSL).super_Compiler.ir.spirv.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data + 8);
  if (iVar3._M_current ==
      *(pointer *)
       ((long)&(this->super_CompilerGLSL).super_Compiler.ir.spirv.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data + 0x10)) {
    ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (this_00,iVar3,&local_218[0].id);
  }
  else {
    *iVar3._M_current = local_218[0].id;
    *(uint **)((long)&(this->super_CompilerGLSL).super_Compiler.ir.spirv.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data + 8) = iVar3._M_current + 1;
  }
  SmallVector<spirv_cross::Instruction,_8UL>::reserve
            (&pSVar8->ops,(pSVar8->ops).super_VectorView<spirv_cross::Instruction>.buffer_size + 1);
  pIVar4 = (pSVar8->ops).super_VectorView<spirv_cross::Instruction>.ptr;
  sVar1 = (pSVar8->ops).super_VectorView<spirv_cross::Instruction>.buffer_size;
  pIVar4[sVar1].op = 0x39;
  pIVar4[sVar1].count = 0;
  pIVar4[sVar1].offset = (uint32_t)((ulong)((long)__position._M_current - (long)puVar2) >> 2);
  pIVar4[sVar1].length = 3;
  (pSVar8->ops).super_VectorView<spirv_cross::Instruction>.buffer_size = sVar1 + 1;
  SPIREntryPoint::SPIREntryPoint((SPIREntryPoint *)local_120,pSVar5);
  local_218[0].id = id_00;
  local_120._0_4_ = id_00;
  SPIREntryPoint::SPIREntryPoint((SPIREntryPoint *)local_210,(SPIREntryPoint *)local_120);
  ::std::
  _Hashtable<spirv_cross::TypedID<(spirv_cross::Types)4>,std::pair<spirv_cross::TypedID<(spirv_cross::Types)4>const,spirv_cross::SPIREntryPoint>,std::allocator<std::pair<spirv_cross::TypedID<(spirv_cross::Types)4>const,spirv_cross::SPIREntryPoint>>,std::__detail::_Select1st,std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)4>>,std::hash<spirv_cross::TypedID<(spirv_cross::Types)4>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<unsigned_int,spirv_cross::SPIREntryPoint>>
            ((_Hashtable<spirv_cross::TypedID<(spirv_cross::Types)4>,std::pair<spirv_cross::TypedID<(spirv_cross::Types)4>const,spirv_cross::SPIREntryPoint>,std::allocator<std::pair<spirv_cross::TypedID<(spirv_cross::Types)4>const,spirv_cross::SPIREntryPoint>>,std::__detail::_Select1st,std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)4>>,std::hash<spirv_cross::TypedID<(spirv_cross::Types)4>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&(this->super_CompilerGLSL).super_Compiler.ir.entry_points,local_218);
  ::std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_188);
  local_210._80_8_ = 0;
  if ((TypedID<(spirv_cross::Types)2> *)local_210._72_8_ !=
      (TypedID<(spirv_cross::Types)2> *)(local_210 + 0x60)) {
    free((void *)local_210._72_8_);
  }
  if ((undefined1 *)local_210._40_8_ != local_210 + 0x38) {
    operator_delete((void *)local_210._40_8_);
  }
  if ((undefined1 *)local_210._8_8_ != local_210 + 0x18) {
    operator_delete((void *)local_210._8_8_);
  }
  this_01 = &(this->super_CompilerGLSL).super_Compiler.ir.meta;
  local_218[0].id = (this->super_CompilerGLSL).super_Compiler.ir.default_entry_point.id;
  pmVar9 = ::std::__detail::
           _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)this_01,local_218);
  local_21c.id = id_00;
  this_02 = ::std::__detail::
            _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)this_01,&local_21c);
  Meta::operator=(this_02,pmVar9);
  local_218[0].id = (this->super_CompilerGLSL).super_Compiler.ir.default_entry_point.id;
  pmVar9 = ::std::__detail::
           _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)this_01,local_218);
  (pmVar9->decoration).alias._M_string_length = 0;
  *(pmVar9->decoration).alias._M_dataplus._M_p = '\0';
  (this->super_CompilerGLSL).super_Compiler.ir.default_entry_point.id = id_00;
  ::std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_98);
  local_120._80_8_ = 0;
  if ((TypedID<(spirv_cross::Types)2> *)local_120._72_8_ !=
      (TypedID<(spirv_cross::Types)2> *)(local_120 + 0x60)) {
    free((void *)local_120._72_8_);
  }
  if ((undefined1 *)local_120._40_8_ != local_120 + 0x38) {
    operator_delete((void *)local_120._40_8_);
  }
  if ((undefined1 *)local_120._8_8_ != local_120 + 0x18) {
    operator_delete((void *)local_120._8_8_);
  }
  return;
}

Assistant:

void CompilerMSL::emit_mesh_entry_point()
{
	auto &ep = get_entry_point();
	auto &f = get<SPIRFunction>(ir.default_entry_point);

	const uint32_t func_id = ir.increase_bound_by(3);
	const uint32_t block_id = func_id + 1;
	const uint32_t ret_id = func_id + 2;
	auto &wrapped_main = set<SPIRFunction>(func_id, f.return_type, f.function_type);

	wrapped_main.blocks.push_back(block_id);
	wrapped_main.entry_block = block_id;

	auto &wrapped_entry = set<SPIRBlock>(block_id);
	wrapped_entry.terminator = SPIRBlock::Return;

	// Push call to original 'main'
	Instruction ix = {};
	ix.op = OpFunctionCall;
	ix.offset = uint32_t(ir.spirv.size());
	ix.length = 3;

	ir.spirv.push_back(f.return_type);
	ir.spirv.push_back(ret_id);
	ir.spirv.push_back(ep.self);

	wrapped_entry.ops.push_back(ix);

	// relace entry-point for new one
	SPIREntryPoint proxy_ep = ep;
	proxy_ep.self = func_id;
	ir.entry_points.insert(std::make_pair(func_id, proxy_ep));
	ir.meta[func_id] = ir.meta[ir.default_entry_point];
	ir.meta[ir.default_entry_point].decoration.alias.clear();

	ir.default_entry_point = func_id;
}